

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_devices.cpp
# Opt level: O3

void print_device_collection(cubeb_device_collection *collection,FILE *f)

{
  cubeb_device_type cVar1;
  cubeb_device_fmt cVar2;
  cubeb_device_info *pcVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  char local_a8 [64];
  cubeb_device_collection *local_68;
  FILE *local_60;
  ulong local_58;
  char *local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  if (collection->count != 0) {
    uVar6 = 0;
    uVar9 = 1;
    local_68 = collection;
    local_60 = (FILE *)f;
    do {
      pcVar3 = local_68->device;
      local_a8[0x30] = '\0';
      local_a8[0x31] = '\0';
      local_a8[0x32] = '\0';
      local_a8[0x33] = '\0';
      local_a8[0x34] = '\0';
      local_a8[0x35] = '\0';
      local_a8[0x36] = '\0';
      local_a8[0x37] = '\0';
      local_a8[0x38] = '\0';
      local_a8[0x39] = '\0';
      local_a8[0x3a] = '\0';
      local_a8[0x3b] = '\0';
      local_a8[0x3c] = '\0';
      local_a8[0x3d] = '\0';
      local_a8[0x3e] = '\0';
      local_a8[0x3f] = '\0';
      local_a8[0x20] = '\0';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      local_a8[0x28] = '\0';
      local_a8[0x29] = '\0';
      local_a8[0x2a] = '\0';
      local_a8[0x2b] = '\0';
      local_a8[0x2c] = '\0';
      local_a8[0x2d] = '\0';
      local_a8[0x2e] = '\0';
      local_a8[0x2f] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = '\0';
      local_a8[0x19] = '\0';
      local_a8[0x1a] = '\0';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = '\0';
      local_a8[9] = '\0';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_38 = "unknown?";
      if ((ulong)pcVar3[uVar6].state < 3) {
        local_38 = &DAT_00139544 + *(int *)(&DAT_00139544 + (ulong)pcVar3[uVar6].state * 4);
      }
      cVar1 = pcVar3[uVar6].type;
      cVar2 = pcVar3[uVar6].default_format;
      if ((int)cVar2 < 0x1000) {
        local_40 = "S16LE";
        if (cVar2 != CUBEB_DEVICE_FMT_S16LE) {
          if (cVar2 == CUBEB_DEVICE_FMT_S16BE) {
            local_40 = "S16BE";
          }
          else {
LAB_00119256:
            local_40 = "unknown?";
          }
        }
      }
      else if (cVar2 == CUBEB_DEVICE_FMT_F32LE) {
        local_40 = "F32LE";
      }
      else {
        if (cVar2 != CUBEB_DEVICE_FMT_F32BE) goto LAB_00119256;
        local_40 = "F32BE";
      }
      cVar2 = pcVar3[uVar6].format;
      if ((cVar2 & CUBEB_DEVICE_FMT_S16LE) != 0) {
        sVar5 = strlen(local_a8);
        builtin_strncpy(local_a8 + sVar5," S16LE",7);
      }
      if ((cVar2 & CUBEB_DEVICE_FMT_S16BE) != 0) {
        sVar5 = strlen(local_a8);
        builtin_strncpy(local_a8 + sVar5," S16BE",7);
      }
      if ((cVar2 >> 0xc & 1) != 0) {
        sVar5 = strlen(local_a8);
        builtin_strncpy(local_a8 + sVar5," F32LE",7);
      }
      if ((cVar2 >> 0xd & 1) != 0) {
        sVar5 = strlen(local_a8);
        builtin_strncpy(local_a8 + sVar5," F32BE",7);
      }
      pcVar8 = "unknown?";
      if (cVar1 == CUBEB_DEVICE_TYPE_OUTPUT) {
        pcVar8 = "output";
      }
      if (cVar1 == CUBEB_DEVICE_TYPE_INPUT) {
        pcVar8 = "input";
      }
      pcVar7 = " (PREFERRED)";
      if (pcVar3[uVar6].preferred == CUBEB_DEVICE_PREF_NONE) {
        pcVar7 = "";
      }
      local_48 = (ulong)pcVar3[uVar6].max_channels;
      local_50 = local_a8 + (local_a8[0] != '\0');
      local_58 = (ulong)pcVar3[uVar6].min_rate;
      fprintf(local_60,
              "dev: \"%s\"%s\n\tName:    \"%s\"\n\tGroup:   \"%s\"\n\tVendor:  \"%s\"\n\tType:    %s\n\tState:   %s\n\tCh:      %u\n\tFormat:  %s (0x%x) (default: %s)\n\tRate:    %u - %u (default: %u)\n\tLatency: lo %u frames, hi %u frames\n"
              ,pcVar3[uVar6].device_id,pcVar7,pcVar3[uVar6].friendly_name,pcVar3[uVar6].group_id,
              pcVar3[uVar6].vendor_name,pcVar8,local_38,local_48,local_50,(ulong)cVar2,local_40,
              local_58,(ulong)pcVar3[uVar6].max_rate,(ulong)pcVar3[uVar6].default_rate,
              (ulong)pcVar3[uVar6].latency_lo,(ulong)pcVar3[uVar6].latency_hi);
      bVar4 = uVar9 < local_68->count;
      uVar6 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  return;
}

Assistant:

static void
print_device_collection(cubeb_device_collection * collection, FILE * f)
{
  uint32_t i;

  for (i = 0; i < collection->count; i++)
    print_device_info(&collection->device[i], f);
}